

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_annotations.cc
# Opt level: O3

double ValgrindSlowdown(void)

{
  int iVar1;
  char *__nptr;
  double dVar2;
  
  dVar2 = ValgrindSlowdown::slowdown;
  iVar1 = RunningOnValgrind();
  if (iVar1 == 0) {
    dVar2 = 1.0;
  }
  else if ((dVar2 == 0.0) && (!NAN(dVar2))) {
    __nptr = getenv("VALGRIND_SLOWDOWN");
    if (__nptr == (char *)0x0) {
      dVar2 = 50.0;
      ValgrindSlowdown::slowdown = dVar2;
    }
    else {
      dVar2 = atof(__nptr);
      ValgrindSlowdown::slowdown = dVar2;
    }
  }
  return dVar2;
}

Assistant:

double ValgrindSlowdown(void) {
  /* Same initialization hack as in RunningOnValgrind(). */
  static volatile double slowdown = 0.0;
  double local_slowdown = slowdown;
  ANNOTATE_BENIGN_RACE(&slowdown, "safe hack");
  if (RunningOnValgrind() == 0) {
    return 1.0;
  }
  if (local_slowdown == 0.0) {
    char *env = getenv("VALGRIND_SLOWDOWN");
    slowdown = local_slowdown = env ? atof(env) : 50.0;
  }
  return local_slowdown;
}